

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslkey_p.cpp
# Opt level: O1

QDebug operator<<(QDebug debug,QSslKey *key)

{
  char *pcVar1;
  QSslKeyPrivate *pQVar2;
  int iVar3;
  long *plVar4;
  undefined8 *in_RDX;
  char *pcVar5;
  storage_type *psVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QDebugStateSaver saver;
  undefined1 *local_58;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)key);
  plVar4 = (long *)QDebug::resetFormat();
  *(undefined1 *)(*plVar4 + 0x30) = 0;
  pQVar2 = (key->d).d.ptr;
  QVar7.m_data = (storage_type *)0x8;
  QVar7.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar7);
  QTextStream::operator<<((QTextStream *)pQVar2,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  pQVar2 = (key->d).d.ptr;
  if (*(char *)&pQVar2[3].backend._M_t.
                super___uniq_ptr_impl<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_>
                ._M_t.
                super__Tuple_impl<0UL,_QTlsPrivate::TlsKey_*,_std::default_delete<QTlsPrivate::TlsKey>_>
      == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar2,' ');
  }
  if (*(long **)*in_RDX == (long *)0x0) {
    pcVar5 = "PublicKey";
  }
  else {
    iVar3 = (**(code **)(**(long **)*in_RDX + 0x50))();
    pcVar5 = "PrivateKey";
    if (iVar3 == 1) {
      pcVar5 = "PublicKey";
    }
  }
  pQVar2 = (key->d).d.ptr;
  psVar6 = (storage_type *)0xffffffffffffffff;
  do {
    pcVar1 = psVar6 + (long)(pcVar5 + 1);
    psVar6 = psVar6 + 1;
  } while (*pcVar1 != '\0');
  QVar8.m_data = psVar6;
  QVar8.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar8);
  QTextStream::operator<<((QTextStream *)pQVar2,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  pQVar2 = (key->d).d.ptr;
  if (*(char *)&pQVar2[3].backend._M_t.
                super___uniq_ptr_impl<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_>
                ._M_t.
                super__Tuple_impl<0UL,_QTlsPrivate::TlsKey_*,_std::default_delete<QTlsPrivate::TlsKey>_>
      == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar2,' ');
  }
  pQVar2 = (key->d).d.ptr;
  QVar9.m_data = (storage_type *)0x2;
  QVar9.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar9);
  QTextStream::operator<<((QTextStream *)pQVar2,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  pQVar2 = (key->d).d.ptr;
  if (*(char *)&pQVar2[3].backend._M_t.
                super___uniq_ptr_impl<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_>
                ._M_t.
                super__Tuple_impl<0UL,_QTlsPrivate::TlsKey_*,_std::default_delete<QTlsPrivate::TlsKey>_>
      == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar2,' ');
  }
  pcVar5 = "OPAQUE";
  if ((*(long **)*in_RDX != (long *)0x0) &&
     (iVar3 = (**(code **)(**(long **)*in_RDX + 0x58))(), iVar3 != 0)) {
    if ((*(long **)*in_RDX == (long *)0x0) ||
       (iVar3 = (**(code **)(**(long **)*in_RDX + 0x58))(), iVar3 != 1)) {
      if ((*(long **)*in_RDX == (long *)0x0) ||
         (iVar3 = (**(code **)(**(long **)*in_RDX + 0x58))(), iVar3 != 2)) {
        if (*(long **)*in_RDX == (long *)0x0) {
          pcVar5 = "EC";
        }
        else {
          iVar3 = (**(code **)(**(long **)*in_RDX + 0x58))();
          pcVar5 = "EC";
          if (iVar3 == 4) {
            pcVar5 = "DH";
          }
        }
      }
      else {
        pcVar5 = "DSA";
      }
    }
    else {
      pcVar5 = "RSA";
    }
  }
  pQVar2 = (key->d).d.ptr;
  psVar6 = (storage_type *)0xffffffffffffffff;
  do {
    pcVar1 = psVar6 + (long)(pcVar5 + 1);
    psVar6 = psVar6 + 1;
  } while (*pcVar1 != '\0');
  QVar10.m_data = psVar6;
  QVar10.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar10);
  QTextStream::operator<<((QTextStream *)pQVar2,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  pQVar2 = (key->d).d.ptr;
  if (*(char *)&pQVar2[3].backend._M_t.
                super___uniq_ptr_impl<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_>
                ._M_t.
                super__Tuple_impl<0UL,_QTlsPrivate::TlsKey_*,_std::default_delete<QTlsPrivate::TlsKey>_>
      == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar2,' ');
  }
  pQVar2 = (key->d).d.ptr;
  QVar11.m_data = (storage_type *)0x2;
  QVar11.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar11);
  QTextStream::operator<<((QTextStream *)pQVar2,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  pQVar2 = (key->d).d.ptr;
  if (*(char *)&pQVar2[3].backend._M_t.
                super___uniq_ptr_impl<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_>
                ._M_t.
                super__Tuple_impl<0UL,_QTlsPrivate::TlsKey_*,_std::default_delete<QTlsPrivate::TlsKey>_>
      == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar2,' ');
  }
  if (*(long **)*in_RDX == (long *)0x0) {
    iVar3 = -1;
  }
  else {
    iVar3 = (**(code **)(**(long **)*in_RDX + 0x60))();
  }
  QTextStream::operator<<((QTextStream *)(key->d).d.ptr,iVar3);
  pQVar2 = (key->d).d.ptr;
  if (*(char *)&pQVar2[3].backend._M_t.
                super___uniq_ptr_impl<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_>
                ._M_t.
                super__Tuple_impl<0UL,_QTlsPrivate::TlsKey_*,_std::default_delete<QTlsPrivate::TlsKey>_>
      == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar2,' ');
  }
  QTextStream::operator<<((QTextStream *)(key->d).d.ptr,')');
  pQVar2 = (key->d).d.ptr;
  if (*(char *)&pQVar2[3].backend._M_t.
                super___uniq_ptr_impl<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_>
                ._M_t.
                super__Tuple_impl<0UL,_QTlsPrivate::TlsKey_*,_std::default_delete<QTlsPrivate::TlsKey>_>
      == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar2,' ');
  }
  pQVar2 = (key->d).d.ptr;
  (key->d).d.ptr = (QSslKeyPrivate *)0x0;
  *(QSslKeyPrivate **)debug.stream = pQVar2;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)debug.stream;
}

Assistant:

QDebug operator<<(QDebug debug, const QSslKey &key)
{
    QDebugStateSaver saver(debug);
    debug.resetFormat().nospace();
    debug << "QSslKey("
          << (key.type() == QSsl::PublicKey ? "PublicKey" : "PrivateKey")
          << ", " << (key.algorithm() == QSsl::Opaque ? "OPAQUE" :
                     (key.algorithm() == QSsl::Rsa ? "RSA" :
                     (key.algorithm() == QSsl::Dsa ? "DSA" :
                     (key.algorithm() == QSsl::Dh ? "DH" : "EC"))))
          << ", " << key.length()
          << ')';
    return debug;
}